

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O3

size_t __thiscall Imf_3_2::DeepTiledInputFile::totalTiles(DeepTiledInputFile *this)

{
  LevelMode LVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Data *pDVar6;
  ArgExc *this_00;
  int iVar7;
  
  pDVar6 = this->_data;
  LVar1 = (pDVar6->tileDesc).mode;
  if (LVar1 < RIPMAP_LEVELS) {
    iVar2 = numLevels(this);
    if (0 < iVar2) {
      iVar7 = 0;
      iVar2 = 0;
      do {
        iVar3 = numXTiles(this,iVar2);
        iVar4 = numYTiles(this,iVar2);
        iVar7 = iVar7 + iVar4 * iVar3;
        iVar2 = iVar2 + 1;
        iVar3 = numLevels(this);
      } while (iVar2 < iVar3);
      goto LAB_0016c58c;
    }
  }
  else {
    if (LVar1 != RIPMAP_LEVELS) {
      this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::ArgExc::ArgExc(this_00,"Unknown LevelMode format.");
      __cxa_throw(this_00,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
    }
    if (0 < pDVar6->numYLevels) {
      iVar7 = 0;
      iVar2 = 0;
      do {
        if (0 < pDVar6->numXLevels) {
          iVar3 = 0;
          do {
            iVar4 = numXTiles(this,iVar3);
            iVar5 = numYTiles(this,iVar2);
            iVar7 = iVar7 + iVar5 * iVar4;
            iVar3 = iVar3 + 1;
            pDVar6 = this->_data;
          } while (iVar3 < pDVar6->numXLevels);
        }
        iVar2 = iVar2 + 1;
      } while (iVar2 < pDVar6->numYLevels);
      goto LAB_0016c58c;
    }
  }
  iVar7 = 0;
LAB_0016c58c:
  return (long)iVar7;
}

Assistant:

size_t
DeepTiledInputFile::totalTiles () const
{
    //
    // Calculate the total number of tiles in the file
    //

    int numAllTiles = 0;

    switch (levelMode ())
    {
        case ONE_LEVEL:
        case MIPMAP_LEVELS:

            for (int i_l = 0; i_l < numLevels (); ++i_l)
                numAllTiles += numXTiles (i_l) * numYTiles (i_l);

            break;

        case RIPMAP_LEVELS:

            for (int i_ly = 0; i_ly < numYLevels (); ++i_ly)
                for (int i_lx = 0; i_lx < numXLevels (); ++i_lx)
                    numAllTiles += numXTiles (i_lx) * numYTiles (i_ly);

            break;

        default: throw IEX_NAMESPACE::ArgExc ("Unknown LevelMode format.");
    }
    return numAllTiles;
}